

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  iterator iVar3;
  ostream *poVar4;
  pointer *__ptr;
  file_format format;
  uint uVar5;
  key_type *input_stream;
  ulong uVar6;
  pair<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>,___gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>_>
  pVar7;
  unique_ptr<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>,_std::default_delete<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>_>_>
  output;
  positional_arguments_t positional_arguments;
  compressed_lower_distance_matrix dist;
  named_arguments_t named_arguments;
  cli_arguments_t arguments;
  flagser_parameters params;
  vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>
  vietoris_rips_complex;
  ifstream file_stream;
  persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
  persistence_computer;
  output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
  *local_4d8;
  value_t local_4cc;
  vector<const_char_*,_std::allocator<const_char_*>_> local_4c8;
  undefined1 local_4b0 [24];
  _Alloc_hider local_498;
  pointer local_490;
  undefined1 local_488 [8];
  undefined1 local_480 [40];
  _Alloc_hider _Stack_458;
  __node_base_ptr local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  _Alloc_hider local_438;
  undefined1 local_430 [24];
  __uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_> local_418;
  _Prime_rehash_policy local_410;
  flagser_parameters local_3f8;
  vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_> local_330;
  key_type local_2c8;
  byte abStack_2a8 [488];
  persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
  local_c0;
  
  parse_arguments_abi_cxx11_((cli_arguments_t *)&local_448,argc,argv);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_4c8,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_448);
  local_2c8._M_dataplus._M_p = local_480;
  local_480._0_8_ = 0;
  local_480._8_8_ = local_430._8_8_;
  local_480._16_8_ = (_Hash_node_base *)0x0;
  local_480._24_8_ =
       local_418._M_t.
       super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>
       .super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl;
  local_480._32_8_ = local_410._0_8_;
  _Stack_458._M_p = (pointer)local_410._M_next_resize;
  local_450 = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,char_const*>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_2c8._M_dataplus._M_p,
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)local_430,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>_>_>
              *)&local_2c8);
  flagser_parameters::flagser_parameters(&local_3f8,(named_arguments_t *)local_480);
  paVar1 = &local_2c8.field_2;
  local_2c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"help","");
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_480,&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((iVar3.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
       ._M_cur != (__node_type *)0x0) ||
     (local_4c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_4c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    print_usage_and_exit(-1);
    goto LAB_00116bf8;
  }
  local_2c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"format","");
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_480,&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  format = DISTANCE_MATRIX;
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    local_2c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"lower-distance","");
    iVar2 = std::__cxx11::string::compare((char *)&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 == 0) {
LAB_001167f9:
      format = LOWER_DISTANCE_MATRIX;
    }
    else {
      local_2c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"upper-distance","");
      iVar2 = std::__cxx11::string::compare((char *)&local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if (iVar2 == 0) {
        format = UPPER_DISTANCE_MATRIX;
      }
      else {
        local_2c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"distance","");
        iVar2 = std::__cxx11::string::compare((char *)&local_2c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        if (iVar2 != 0) {
          local_2c8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"point-cloud","");
          iVar2 = std::__cxx11::string::compare((char *)&local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != paVar1) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          if (iVar2 == 0) {
            format = POINT_CLOUD;
          }
          else {
            local_2c8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"dipha","");
            iVar2 = std::__cxx11::string::compare((char *)&local_2c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != paVar1) {
              operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1
                             );
            }
            format = DIPHA;
            if (iVar2 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"The input format ",0x11);
              poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4," is not supported.",0x12);
              std::endl<char,std::char_traits<char>>(poVar4);
              print_usage_and_exit(-1);
              goto LAB_001167f9;
            }
          }
        }
      }
    }
  }
  local_4cc = local_3f8.threshold;
  input_stream = &local_2c8;
  std::ifstream::ifstream
            (input_stream,
             *local_4c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start,_S_in);
  if ((*local_4c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start == (char *)0x0) ||
     ((abStack_2a8[*(long *)(local_2c8._M_dataplus._M_p + -0x18)] & 5) == 0)) {
    if (*local_4c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_start == (char *)0x0) {
      input_stream = (key_type *)&std::cin;
    }
    read_file((compressed_lower_distance_matrix *)local_4b0,(istream *)input_stream,format);
    uVar6 = (long)local_490 - (long)local_498._M_p;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"distance matrix with ",0x15);
    iVar2 = (int)(uVar6 >> 3);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," points",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    pVar7 = std::
            __minmax_element<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_4b0._0_8_,local_4b0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value range: [",0xe);
    poVar4 = std::ostream::_M_insert<double>((double)*pVar7.first._M_current._M_current);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
    poVar4 = std::ostream::_M_insert<double>((double)*pVar7.second._M_current._M_current);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    uVar5 = iVar2 - 2;
    if ((int)(uint)local_3f8.max_dimension <= (int)uVar5) {
      uVar5 = (uint)local_3f8.max_dimension;
    }
    vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
    vietoris_rips_complex_t
              (&local_330,(compressed_distance_matrix<(compressed_matrix_layout)0> *)local_4b0,
               (unsigned_short)uVar5,2);
    get_output<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>>>
              ((flagser_parameters *)&local_4d8);
    (*local_4d8->_vptr_output_t[2])(local_4d8,&local_330);
    persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
    ::persistence_computer_t(&local_c0,&local_330,local_4d8,local_3f8.max_entries,2,local_4cc);
    persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
    ::compute_persistence(&local_c0,0,(unsigned_short)uVar5,false);
    (*local_4d8->_vptr_output_t[0xb])();
    std::_Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>::~_Deque_base
              (&local_c0.columns_to_reduce.
                super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>);
    if (local_c0.multiplicative_inverse.super__Vector_base<short,_std::allocator<short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.multiplicative_inverse.
                      super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0.multiplicative_inverse.
                            super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.multiplicative_inverse.
                            super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_4d8 !=
        (output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
         *)0x0) {
      (*local_4d8->_vptr_output_t[1])();
    }
    if (local_330._vertices_of_edge.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_330._vertices_of_edge.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_330._vertices_of_edge.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_330._vertices_of_edge.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_330.binomial_coeff.B);
    if (local_498._M_p != (pointer)0x0) {
      operator_delete(local_498._M_p,(long)local_488 - (long)local_498._M_p);
    }
    if ((pointer)local_4b0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ - local_4b0._0_8_);
    }
    std::ifstream::~ifstream(&local_2c8);
    if ((_Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>)
        local_3f8.filtration_algorithm._M_t.
        super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>.
        _M_t.
        super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>
        .super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl !=
        (filtration_algorithm_t *)0x0) {
      (*(*(_func_int ***)
          local_3f8.filtration_algorithm._M_t.
          super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>
          ._M_t.
          super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>
          .super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl)[1])();
    }
    local_3f8.filtration_algorithm._M_t.
    super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>._M_t
    .super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>.
    super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl =
         (__uniq_ptr_data<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>,_true,_true>
          )(__uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>)
           0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8.hdf5_type._M_dataplus._M_p != &local_3f8.hdf5_type.field_2) {
      operator_delete(local_3f8.hdf5_type._M_dataplus._M_p,
                      local_3f8.hdf5_type.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8.cache._M_dataplus._M_p != &local_3f8.cache.field_2) {
      operator_delete(local_3f8.cache._M_dataplus._M_p,
                      local_3f8.cache.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8.output_format._M_dataplus._M_p != &local_3f8.output_format.field_2) {
      operator_delete(local_3f8.output_format._M_dataplus._M_p,
                      local_3f8.output_format.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8.output_name._M_dataplus._M_p != &local_3f8.output_name.field_2) {
      operator_delete(local_3f8.output_name._M_dataplus._M_p,
                      local_3f8.output_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8.input_format._M_dataplus._M_p != &local_3f8.input_format.field_2) {
      operator_delete(local_3f8.input_format._M_dataplus._M_p,
                      local_3f8.input_format.field_2._M_allocated_capacity + 1);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_480);
    if (local_4c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_4c8.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_4c8.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_430);
    if ((void *)local_448._M_allocated_capacity != (void *)0x0) {
      operator_delete((void *)local_448._M_allocated_capacity,(long)local_438._M_p - local_448._0_8_
                     );
    }
    return 0;
  }
LAB_00116bf8:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"couldn\'t open file ",0x13);
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           *local_4c8.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(-1);
}

Assistant:

int main(int argc, char** argv) {
	file_format format = DISTANCE_MATRIX;

	index_t dim_max = 1;
	index_t dim_min = 0;
	value_t threshold = std::numeric_limits<value_t>::max();

#ifdef USE_COEFFICIENTS
	coefficient_t modulus = 2;
#else
	const coefficient_t modulus = 2;
#endif

	try {
		auto arguments = parse_arguments(argc, argv);
		auto positional_arguments = get_positional_arguments(arguments);
		auto named_arguments = get_named_arguments(arguments);
		auto params = flagser_parameters(named_arguments);

		if (named_arguments.find("help") != named_arguments.end()) { print_usage_and_exit(-1); }
		if (positional_arguments.size() == 0) print_usage_and_exit(-1);

		named_arguments_t::const_iterator it;
		if ((it = named_arguments.find("format")) != named_arguments.end()) {
			if (it->second == std::string("lower-distance"))
				format = LOWER_DISTANCE_MATRIX;
			else if (it->second == std::string("upper-distance"))
				format = UPPER_DISTANCE_MATRIX;
			else if (it->second == std::string("distance"))
				format = DISTANCE_MATRIX;
			else if (it->second == std::string("point-cloud"))
				format = POINT_CLOUD;
			else if (it->second == std::string("dipha"))
				format = DIPHA;
			else {
				std::cerr << "The input format " << format << " is not supported." << std::endl;
				print_usage_and_exit(-1);
			}
		}

		dim_max = params.max_dimension;
		threshold = params.threshold;

#ifdef USE_COEFFICIENTS
		modulus = params.modulus;
#endif

		size_t max_entries = std::numeric_limits<size_t>::max();
		max_entries = params.max_entries;

		std::ifstream file_stream(positional_arguments[0]);
		if (positional_arguments[0] && file_stream.fail()) {
			std::cerr << "couldn't open file " << positional_arguments[0] << std::endl;
			exit(-1);
		}

		compressed_lower_distance_matrix dist = read_file(positional_arguments[0] ? file_stream : std::cin, format);

		index_t n = index_t(dist.size());

		std::cout << "distance matrix with " << n << " points" << std::endl;

		auto value_range = std::minmax_element(dist.distances.begin(), dist.distances.end());
		std::cout << "value range: [" << *value_range.first << "," << *value_range.second << "]" << std::endl;

		dim_max = std::min(dim_max, n - 2);

		vietoris_rips_complex_t<decltype(dist)> vietoris_rips_complex(dist, dim_max, modulus);
		auto output = get_output<decltype(vietoris_rips_complex)>(params);
		output->set_complex(&vietoris_rips_complex);

		persistence_computer_t<decltype(vietoris_rips_complex)> persistence_computer(
		    vietoris_rips_complex, output.get(), max_entries, modulus, threshold);
		persistence_computer.compute_persistence(dim_min, dim_max, false);
		output->print_aggregated_results();
	} catch (const std::exception& e) { std::cout << e.what() << std::endl; }
}